

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::updateScrollBarSize(CGUIListBox *this,s32 size)

{
  int iVar1;
  int x2;
  int in_ESI;
  rect<int> *in_RDI;
  IGUIElement *unaff_retaddr;
  recti r;
  undefined4 in_stack_ffffffffffffffd4;
  rect<int> local_1c;
  int local_c;
  rect<int> *r_00;
  
  local_c = in_ESI;
  r_00 = in_RDI;
  local_1c = IGUIElement::getRelativePosition((IGUIElement *)in_RDI[0x18].UpperLeftCorner);
  iVar1 = core::rect<int>::getWidth(&local_1c);
  if (in_ESI != iVar1) {
    iVar1 = core::rect<int>::getWidth(in_RDI + 3);
    iVar1 = iVar1 - local_c;
    x2 = core::rect<int>::getWidth(in_RDI + 3);
    core::rect<int>::getHeight(in_RDI + 3);
    core::rect<int>::rect
              ((rect<int> *)CONCAT44(in_stack_ffffffffffffffd4,in_ESI),(int)((ulong)in_RDI >> 0x20),
               (int)in_RDI,x2,iVar1);
    IGUIElement::setRelativePosition(unaff_retaddr,r_00);
  }
  return;
}

Assistant:

void CGUIListBox::updateScrollBarSize(s32 size)
{
	if (size != ScrollBar->getRelativePosition().getWidth()) {
		core::recti r(RelativeRect.getWidth() - size, 0, RelativeRect.getWidth(), RelativeRect.getHeight());
		ScrollBar->setRelativePosition(r);
	}
}